

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintString
          (FastFieldValuePrinter *this,string *val,BaseTextGenerator *generator)

{
  char *in_RCX;
  string_view src;
  string local_30;
  
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  if ((lts_20250127 *)val->_M_string_length != (lts_20250127 *)0x0) {
    src._M_str = in_RCX;
    src._M_len = (size_t)(val->_M_dataplus)._M_p;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_30,(lts_20250127 *)val->_M_string_length,src);
    (*generator->_vptr_BaseTextGenerator[5])
              (generator,local_30._M_dataplus._M_p,local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintString(
    const std::string& val, BaseTextGenerator* generator) const {
  generator->PrintLiteral("\"");
  if (!val.empty()) {
    generator->PrintString(absl::CEscape(val));
  }
  generator->PrintLiteral("\"");
}